

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_dateVal(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  Value local_90;
  Value local_80;
  undefined4 local_6c;
  Value local_68;
  time_t local_58;
  time_t t;
  String local_40;
  undefined1 local_30 [8];
  Value date;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::String::String(&local_40,"dateStr");
  MiniScript::Context::GetVar((Context *)local_30,(String *)partialResult,(LocalOnlyMode)&local_40);
  MiniScript::String::~String(&local_40);
  bVar1 = MiniScript::Value::IsNull((Value *)local_30);
  if (bVar1) {
    time(&local_58);
  }
  else {
    if (local_30[0] == Number) {
      MiniScript::Value::Value(&local_68,(Value *)local_30);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_68,true);
      MiniScript::Value::~Value(&local_68);
      goto LAB_0011a450;
    }
    MiniScript::Value::ToString(&local_80,(Machine *)local_30);
    local_58 = MiniScript::ParseDate((String *)&local_80);
    MiniScript::String::~String((String *)&local_80);
  }
  dVar2 = (double)local_58;
  dVar3 = dateTimeEpoch();
  MiniScript::Value::Value(&local_90,dVar2 - dVar3);
  MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_90,true);
  MiniScript::Value::~Value(&local_90);
LAB_0011a450:
  local_6c = 1;
  MiniScript::Value::~Value((Value *)local_30);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_dateVal(Context *context, IntrinsicResult partialResult) {
	Value date = context->GetVar("dateStr");
	time_t t;
	if (date.IsNull()) {
		time(&t);
	} else if (date.type == ValueType::Number) {
		return IntrinsicResult(date);
	} else {
		t = ParseDate(date.ToString());
	}
	return IntrinsicResult((double)t - dateTimeEpoch());
}